

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcTriangleFans.cpp
# Opt level: O0

O3DGCErrorCode o3dgc::LoadUIntData(Vector<long> *data,BinaryStream *bstream,unsigned_long *iterator)

{
  BinaryStream *this;
  unsigned_long local_38;
  ulong local_30;
  unsigned_long i;
  unsigned_long size;
  unsigned_long *iterator_local;
  BinaryStream *bstream_local;
  Vector<long> *data_local;
  
  size = (unsigned_long)iterator;
  iterator_local = (unsigned_long *)bstream;
  bstream_local = (BinaryStream *)data;
  BinaryStream::ReadUInt32ASCII(bstream,iterator);
  i = BinaryStream::ReadUInt32ASCII((BinaryStream *)iterator_local,(unsigned_long *)size);
  Vector<long>::Allocate((Vector<long> *)bstream_local,i);
  Vector<long>::Clear((Vector<long> *)bstream_local);
  for (local_30 = 0; this = bstream_local, local_30 < i; local_30 = local_30 + 1) {
    local_38 = BinaryStream::ReadUIntASCII((BinaryStream *)iterator_local,(unsigned_long *)size);
    Vector<long>::PushBack((Vector<long> *)this,(long *)&local_38);
  }
  return O3DGC_OK;
}

Assistant:

O3DGCErrorCode    LoadUIntData(Vector<long> & data,
                                  const BinaryStream & bstream,
                                  unsigned long & iterator) 
    {
        bstream.ReadUInt32ASCII(iterator);
        const unsigned long size = bstream.ReadUInt32ASCII(iterator);
        data.Allocate(size);
        data.Clear();
        for(unsigned long i = 0; i < size; ++i)
        {
            data.PushBack(bstream.ReadUIntASCII(iterator));
        }
        return O3DGC_OK;
    }